

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * soul::Value::fromExternalValue
                  (Value *__return_storage_ptr__,Type *targetType,ValueView *sourceValue,
                  ConstantTable *constantTable,StringDictionary *stringDictionary)

{
  ConversionState c;
  ConstantTable *local_18;
  StringDictionary *local_10;
  
  local_18 = constantTable;
  local_10 = stringDictionary;
  fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::ConstantTable&,soul::
  StringDictionary&)::ConversionState::convert(soul::Type_const&,choc::value::ValueView_const__
            (__return_storage_ptr__,&local_18,targetType,sourceValue);
  return __return_storage_ptr__;
}

Assistant:

Value Value::fromExternalValue (const Type& targetType, const choc::value::ValueView& sourceValue,
                                ConstantTable& constantTable, StringDictionary& stringDictionary)
{
    // put all conversion state into a single object to avoid lambdas needing to capture more than a single pointer to the state
    struct ConversionState
    {
        ConstantTable& constants;
        StringDictionary& dictionary;

        static Value castOrThrow (const Type& type, Value&& v)
        {
            if (v.getType().isIdentical (type))
                return std::move (v);

            CompileMessage errorMessage;
            auto result = v.tryCastToType (type, errorMessage);

            if (! result.isValid())
                throwError (errorMessage);

            return result;
        }

        Value convert (const Type& targetType, const choc::value::ValueView& source)
        {
            if (source.isInt32())    return castOrThrow (targetType, Value::createInt32 (source.getInt32()));
            if (source.isInt64())    return castOrThrow (targetType, Value::createInt64 (source.getInt64()));
            if (source.isFloat32())  return castOrThrow (targetType, Value (source.getFloat32()));
            if (source.isFloat64())  return castOrThrow (targetType, Value (source.getFloat64()));
            if (source.isBool())     return castOrThrow (targetType, Value (source.getBool()));
            if (source.isString())   return castOrThrow (targetType, Value::createStringLiteral (dictionary.getHandleForString (std::string (source.getString()))));

            if (source.isVector())
            {
                auto size = source.size();

                if (size == 1 && targetType.isPrimitive())
                    return convert (targetType, source[0]);

                if (! targetType.isVector())
                    throwError (Errors::cannotCastBetween ("vector", targetType.getDescription()));

                auto elementType = targetType.getVectorElementType();
                auto result = Value::zeroInitialiser (Type::createVector (elementType, size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isArray())
            {
                auto size = source.size();

                if (targetType.isUnsizedArray())
                {
                    auto elementType = targetType.getElementType();
                    auto fixedArray = convert (elementType.createArray (size), source);
                    return Value::createUnsizedArray (elementType, constants.getHandleForValue (std::move (fixedArray)));
                }

                if (! (targetType.isArray() && size == targetType.getArraySize()))
                    throwError (Errors::cannotCastBetween ("array[" + std::to_string (size) + "]", targetType.getDescription()));

                auto elementType = targetType.getArrayElementType();
                auto result = Value::zeroInitialiser (elementType.createArray (size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isObject())
            {
                if (targetType.isStruct())
                {
                    auto& targetStruct = targetType.getStructRef();
                    auto numMembers = source.size();

                    if (targetStruct.getMembers().size() == numMembers)
                    {
                        auto result = Value::zeroInitialiser (targetType);

                        for (uint32_t j = 0; j < targetStruct.getMembers().size(); ++j)
                        {
                            auto& m = targetStruct.getMembers()[j];
                            bool found = false;

                            for (uint32_t i = 0; i < numMembers; ++i)
                            {
                                auto sourceMember = source.getObjectMemberAt (i);

                                if (m.name == sourceMember.name)
                                {
                                    result.modifySubElementInPlace (j, convert (m.type, sourceMember.value));
                                    found = true;
                                    break;
                                }
                            }

                            if (! found)
                                throwError (Errors::unknownMemberInStruct (m.name, targetStruct.getName()));
                        }

                        return result;
                    }
                }

                throwError (Errors::cannotCastBetween ("struct " + std::string (source.getObjectClassName()),
                                                       targetType.getDescription()));
            }

            return {};
        }
    };

    ConversionState c { constantTable, stringDictionary };
    return c.convert (targetType, sourceValue);
}